

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O2

void __thiscall
gtl::
dense_hashtable<s2shapeutil::ShapeEdgeId,s2shapeutil::ShapeEdgeId,s2shapeutil::ShapeEdgeIdHash,gtl::dense_hash_set<s2shapeutil::ShapeEdgeId,s2shapeutil::ShapeEdgeIdHash,std::equal_to<s2shapeutil::ShapeEdgeId>,std::allocator<s2shapeutil::ShapeEdgeId>>::Identity,gtl::dense_hash_set<s2shapeutil::ShapeEdgeId,s2shapeutil::ShapeEdgeIdHash,std::equal_to<s2shapeutil::ShapeEdgeId>,std::allocator<s2shapeutil::ShapeEdgeId>>::SetKey,std::equal_to<s2shapeutil::ShapeEdgeId>,std::allocator<s2shapeutil::ShapeEdgeId>>
::
copy_elements<std::move_iterator<gtl::dense_hashtable_iterator<s2shapeutil::ShapeEdgeId,s2shapeutil::ShapeEdgeId,s2shapeutil::ShapeEdgeIdHash,gtl::dense_hash_set<s2shapeutil::ShapeEdgeId,s2shapeutil::ShapeEdgeIdHash,std::equal_to<s2shapeutil::ShapeEdgeId>,std::allocator<s2shapeutil::ShapeEdgeId>>::Identity,gtl::dense_hash_set<s2shapeutil::ShapeEdgeId,s2shapeutil::ShapeEdgeIdHash,std::equal_to<s2shapeutil::ShapeEdgeId>,std::allocator<s2shapeutil::ShapeEdgeId>>::SetKey,std::equal_to<s2shapeutil::ShapeEdgeId>,std::allocator<s2shapeutil::ShapeEdgeId>>>>
          (dense_hashtable<s2shapeutil::ShapeEdgeId,s2shapeutil::ShapeEdgeId,s2shapeutil::ShapeEdgeIdHash,gtl::dense_hash_set<s2shapeutil::ShapeEdgeId,s2shapeutil::ShapeEdgeIdHash,std::equal_to<s2shapeutil::ShapeEdgeId>,std::allocator<s2shapeutil::ShapeEdgeId>>::Identity,gtl::dense_hash_set<s2shapeutil::ShapeEdgeId,s2shapeutil::ShapeEdgeIdHash,std::equal_to<s2shapeutil::ShapeEdgeId>,std::allocator<s2shapeutil::ShapeEdgeId>>::SetKey,std::equal_to<s2shapeutil::ShapeEdgeId>,std::allocator<s2shapeutil::ShapeEdgeId>>
           *this,move_iterator<gtl::dense_hashtable_iterator<s2shapeutil::ShapeEdgeId,_s2shapeutil::ShapeEdgeId,_s2shapeutil::ShapeEdgeIdHash,_gtl::dense_hash_set<s2shapeutil::ShapeEdgeId,_s2shapeutil::ShapeEdgeIdHash,_std::equal_to<s2shapeutil::ShapeEdgeId>,_std::allocator<s2shapeutil::ShapeEdgeId>_>::Identity,_gtl::dense_hash_set<s2shapeutil::ShapeEdgeId,_s2shapeutil::ShapeEdgeIdHash,_std::equal_to<s2shapeutil::ShapeEdgeId>,_std::allocator<s2shapeutil::ShapeEdgeId>_>::SetKey,_std::equal_to<s2shapeutil::ShapeEdgeId>,_std::allocator<s2shapeutil::ShapeEdgeId>_>_>
                 src_first,
          move_iterator<gtl::dense_hashtable_iterator<s2shapeutil::ShapeEdgeId,_s2shapeutil::ShapeEdgeId,_s2shapeutil::ShapeEdgeIdHash,_gtl::dense_hash_set<s2shapeutil::ShapeEdgeId,_s2shapeutil::ShapeEdgeIdHash,_std::equal_to<s2shapeutil::ShapeEdgeId>,_std::allocator<s2shapeutil::ShapeEdgeId>_>::Identity,_gtl::dense_hash_set<s2shapeutil::ShapeEdgeId,_s2shapeutil::ShapeEdgeIdHash,_std::equal_to<s2shapeutil::ShapeEdgeId>,_std::allocator<s2shapeutil::ShapeEdgeId>_>::SetKey,_std::equal_to<s2shapeutil::ShapeEdgeId>,_std::allocator<s2shapeutil::ShapeEdgeId>_>_>
          src_last,pointer dest_table,size_type dest_bucket_count)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  
  if ((dest_bucket_count & dest_bucket_count - 1) != 0) {
    __assert_fail("(dest_bucket_count & (dest_bucket_count - 1)) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/densehashtable.h"
                  ,0x2b4,
                  "void gtl::dense_hashtable<s2shapeutil::ShapeEdgeId, s2shapeutil::ShapeEdgeId, s2shapeutil::ShapeEdgeIdHash, gtl::dense_hash_set<s2shapeutil::ShapeEdgeId, s2shapeutil::ShapeEdgeIdHash>::Identity, gtl::dense_hash_set<s2shapeutil::ShapeEdgeId, s2shapeutil::ShapeEdgeIdHash>::SetKey, std::equal_to<s2shapeutil::ShapeEdgeId>, std::allocator<s2shapeutil::ShapeEdgeId>>::copy_elements(Iter, Iter, pointer, size_type) [Value = s2shapeutil::ShapeEdgeId, Key = s2shapeutil::ShapeEdgeId, HashFcn = s2shapeutil::ShapeEdgeIdHash, ExtractKey = gtl::dense_hash_set<s2shapeutil::ShapeEdgeId, s2shapeutil::ShapeEdgeIdHash>::Identity, SetKey = gtl::dense_hash_set<s2shapeutil::ShapeEdgeId, s2shapeutil::ShapeEdgeIdHash>::SetKey, EqualKey = std::equal_to<s2shapeutil::ShapeEdgeId>, Alloc = std::allocator<s2shapeutil::ShapeEdgeId>, Iter = std::move_iterator<gtl::dense_hashtable_iterator<s2shapeutil::ShapeEdgeId, s2shapeutil::ShapeEdgeId, s2shapeutil::ShapeEdgeIdHash, gtl::dense_hash_set<s2shapeutil::ShapeEdgeId, s2shapeutil::ShapeEdgeIdHash>::Identity, gtl::dense_hash_set<s2shapeutil::ShapeEdgeId, s2shapeutil::ShapeEdgeIdHash>::SetKey, std::equal_to<s2shapeutil::ShapeEdgeId>, std::allocator<s2shapeutil::ShapeEdgeId>>>]"
                 );
  }
  do {
    if (src_first._M_current.pos == src_last._M_current.pos) {
      return;
    }
    uVar3 = (long)*src_first._M_current.pos << 0x20 | (ulong)*src_first._M_current.pos >> 0x20;
    uVar2 = 0;
    while( true ) {
      uVar3 = uVar3 & dest_bucket_count - 1;
      bVar1 = dense_hashtable<s2shapeutil::ShapeEdgeId,_s2shapeutil::ShapeEdgeId,_s2shapeutil::ShapeEdgeIdHash,_gtl::dense_hash_set<s2shapeutil::ShapeEdgeId,_s2shapeutil::ShapeEdgeIdHash,_std::equal_to<s2shapeutil::ShapeEdgeId>,_std::allocator<s2shapeutil::ShapeEdgeId>_>::Identity,_gtl::dense_hash_set<s2shapeutil::ShapeEdgeId,_s2shapeutil::ShapeEdgeIdHash,_std::equal_to<s2shapeutil::ShapeEdgeId>,_std::allocator<s2shapeutil::ShapeEdgeId>_>::SetKey,_std::equal_to<s2shapeutil::ShapeEdgeId>,_std::allocator<s2shapeutil::ShapeEdgeId>_>
              ::test_empty((dense_hashtable<s2shapeutil::ShapeEdgeId,_s2shapeutil::ShapeEdgeId,_s2shapeutil::ShapeEdgeIdHash,_gtl::dense_hash_set<s2shapeutil::ShapeEdgeId,_s2shapeutil::ShapeEdgeIdHash,_std::equal_to<s2shapeutil::ShapeEdgeId>,_std::allocator<s2shapeutil::ShapeEdgeId>_>::Identity,_gtl::dense_hash_set<s2shapeutil::ShapeEdgeId,_s2shapeutil::ShapeEdgeIdHash,_std::equal_to<s2shapeutil::ShapeEdgeId>,_std::allocator<s2shapeutil::ShapeEdgeId>_>::SetKey,_std::equal_to<s2shapeutil::ShapeEdgeId>,_std::allocator<s2shapeutil::ShapeEdgeId>_>
                            *)this,uVar3,dest_table);
      if (bVar1) break;
      uVar3 = uVar3 + uVar2 + 1;
      uVar2 = uVar2 + 1;
      if (dest_bucket_count <= uVar2) {
        __assert_fail("num_probes < dest_bucket_count && \"Hashtable is full: an error in key_equal<> or hash<>\""
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/densehashtable.h"
                      ,0x2c2,
                      "void gtl::dense_hashtable<s2shapeutil::ShapeEdgeId, s2shapeutil::ShapeEdgeId, s2shapeutil::ShapeEdgeIdHash, gtl::dense_hash_set<s2shapeutil::ShapeEdgeId, s2shapeutil::ShapeEdgeIdHash>::Identity, gtl::dense_hash_set<s2shapeutil::ShapeEdgeId, s2shapeutil::ShapeEdgeIdHash>::SetKey, std::equal_to<s2shapeutil::ShapeEdgeId>, std::allocator<s2shapeutil::ShapeEdgeId>>::copy_elements(Iter, Iter, pointer, size_type) [Value = s2shapeutil::ShapeEdgeId, Key = s2shapeutil::ShapeEdgeId, HashFcn = s2shapeutil::ShapeEdgeIdHash, ExtractKey = gtl::dense_hash_set<s2shapeutil::ShapeEdgeId, s2shapeutil::ShapeEdgeIdHash>::Identity, SetKey = gtl::dense_hash_set<s2shapeutil::ShapeEdgeId, s2shapeutil::ShapeEdgeIdHash>::SetKey, EqualKey = std::equal_to<s2shapeutil::ShapeEdgeId>, Alloc = std::allocator<s2shapeutil::ShapeEdgeId>, Iter = std::move_iterator<gtl::dense_hashtable_iterator<s2shapeutil::ShapeEdgeId, s2shapeutil::ShapeEdgeId, s2shapeutil::ShapeEdgeIdHash, gtl::dense_hash_set<s2shapeutil::ShapeEdgeId, s2shapeutil::ShapeEdgeIdHash>::Identity, gtl::dense_hash_set<s2shapeutil::ShapeEdgeId, s2shapeutil::ShapeEdgeIdHash>::SetKey, std::equal_to<s2shapeutil::ShapeEdgeId>, std::allocator<s2shapeutil::ShapeEdgeId>>>]"
                     );
      }
    }
    dest_table[uVar3] = *src_first._M_current.pos;
    dense_hashtable_iterator<s2shapeutil::ShapeEdgeId,_s2shapeutil::ShapeEdgeId,_s2shapeutil::ShapeEdgeIdHash,_gtl::dense_hash_set<s2shapeutil::ShapeEdgeId,_s2shapeutil::ShapeEdgeIdHash,_std::equal_to<s2shapeutil::ShapeEdgeId>,_std::allocator<s2shapeutil::ShapeEdgeId>_>::Identity,_gtl::dense_hash_set<s2shapeutil::ShapeEdgeId,_s2shapeutil::ShapeEdgeIdHash,_std::equal_to<s2shapeutil::ShapeEdgeId>,_std::allocator<s2shapeutil::ShapeEdgeId>_>::SetKey,_std::equal_to<s2shapeutil::ShapeEdgeId>,_std::allocator<s2shapeutil::ShapeEdgeId>_>
    ::operator++(&src_first._M_current);
  } while( true );
}

Assistant:

void copy_elements(Iter src_first, Iter src_last, pointer dest_table,
                     size_type dest_bucket_count) {
    assert((dest_bucket_count & (dest_bucket_count - 1)) == 0);  // a power of 2
    // We use a normal iterator to get non-deleted bcks from ht
    // We could use insert() here, but since we know there are
    // no duplicates and no deleted items, we can be more efficient
    for (; src_first != src_last; ++src_first) {
      size_type num_probes = 0;               // how many times we've probed
      size_type bucknum;
      const size_type bucket_count_minus_one = dest_bucket_count - 1;
      for (bucknum = hash(get_key(*src_first)) & bucket_count_minus_one;
           !test_empty(bucknum, dest_table);  // not empty
           bucknum = (bucknum +
                      JUMP_(key, num_probes)) & bucket_count_minus_one) {
        ++num_probes;
        assert(num_probes < dest_bucket_count
               && "Hashtable is full: an error in key_equal<> or hash<>");
      }
      // Copies or moves the value into dest_table.
      set_value(&dest_table[bucknum], *src_first);
    }
  }